

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O2

exr_result_t
create_attr_block(_internal_exr_context *pctxt,exr_attribute_t **attr,size_t dblocksize,
                 int32_t data_len,uint8_t **data_ptr,char *name,int32_t nlen,char *type,int32_t tlen
                 )

{
  exr_result_t eVar1;
  ulong uVar2;
  size_t sVar3;
  exr_attribute_t *peVar4;
  long lVar5;
  ulong uVar6;
  ulong __n;
  exr_attribute_t *__dest;
  exr_attr_box2i_t *peVar7;
  long lVar8;
  
  uVar6 = 0x20;
  if (0 < nlen) {
    uVar6 = (ulong)(nlen + 0x21);
  }
  __n = (ulong)(tlen + 1);
  lVar5 = 0;
  uVar2 = 0;
  if (0 < tlen) {
    uVar2 = __n;
  }
  sVar3 = uVar2 + uVar6;
  if (dblocksize != 0) {
    uVar6 = (ulong)((uint)sVar3 & 7);
    lVar5 = 8 - uVar6;
    if (uVar6 == 0) {
      lVar5 = 0;
    }
    sVar3 = sVar3 + dblocksize + lVar5;
  }
  if (data_len < 1) {
    lVar8 = 0;
  }
  else {
    uVar6 = (ulong)((uint)sVar3 & 7);
    lVar8 = 8 - uVar6;
    if (uVar6 == 0) {
      lVar8 = 0;
    }
    sVar3 = (uint)data_len + sVar3 + lVar8;
  }
  peVar4 = (exr_attribute_t *)(*pctxt->alloc_fn)(sVar3);
  if (peVar4 != (exr_attribute_t *)0x0) {
    __dest = peVar4 + 1;
    peVar4->name_length = '\0';
    peVar4->type_name_length = '\0';
    peVar4->pad[0] = '\0';
    peVar4->pad[1] = '\0';
    peVar4->type = EXR_ATTR_UNKNOWN;
    (peVar4->field_6).d = 0.0;
    peVar4->name = (char *)0x0;
    peVar4->type_name = (char *)0x0;
    *attr = peVar4;
    if (0 < nlen) {
      memcpy(__dest,name,(ulong)(uint)nlen + 1);
      peVar4->name = (char *)__dest;
      peVar4->name_length = (uint8_t)nlen;
      __dest = (exr_attribute_t *)(__dest->pad + ((ulong)(uint)nlen - 0x11));
    }
    if (0 < tlen) {
      memcpy(__dest,type,__n);
      peVar4->type_name = (char *)__dest;
      peVar4->type_name_length = (uint8_t)tlen;
      __dest = (exr_attribute_t *)(__dest->pad + (__n - 0x12));
    }
    peVar7 = (exr_attr_box2i_t *)(__dest->pad + lVar5 + -0x12);
    if (dblocksize != 0) {
      (peVar4->field_6).box2i = peVar7;
      peVar7 = (exr_attr_box2i_t *)((long)&(peVar7->min).field_0 + dblocksize);
    }
    if (data_ptr != (uint8_t **)0x0) {
      if (data_len < 1) {
        *data_ptr = (uint8_t *)0x0;
      }
      else {
        *data_ptr = (uint8_t *)((long)&(peVar7->min).field_0 + lVar8);
      }
    }
    return 0;
  }
  eVar1 = (*pctxt->standard_error)(pctxt,1);
  return eVar1;
}

Assistant:

static exr_result_t
create_attr_block (
    struct _internal_exr_context* pctxt,
    exr_attribute_t**             attr,
    size_t                        dblocksize,
    int32_t                       data_len,
    uint8_t**                     data_ptr,
    const char*                   name,
    int32_t                       nlen,
    const char*                   type,
    int32_t                       tlen)
{
    size_t           alignpad1, alignpad2;
    size_t           attrblocksz = sizeof (exr_attribute_t);
    uint8_t*         ptr;
    exr_attribute_t* nattr;
    exr_attribute_t  nil = {0};
    // not all compilers have this :(
    //const size_t ptralign = _Alignof(void*);
    const size_t ptralign = 8;

    if (nlen > 0) attrblocksz += (size_t) (nlen + 1);
    if (tlen > 0) attrblocksz += (size_t) (tlen + 1);

    if (dblocksize > 0)
    {
        alignpad1 = ptralign - (attrblocksz % ptralign);
        if (alignpad1 == ptralign) alignpad1 = 0;
        attrblocksz += alignpad1;
        attrblocksz += dblocksize;
    }
    else
        alignpad1 = 0;

    if (data_len > 0)
    {
        /* align the extra data to a pointer */
        alignpad2 = ptralign - (attrblocksz % ptralign);
        if (alignpad2 == ptralign) alignpad2 = 0;
        attrblocksz += alignpad2;
        attrblocksz += (size_t) data_len;
    }
    else
        alignpad2 = 0;

    ptr = (uint8_t*) pctxt->alloc_fn (attrblocksz);
    if (!ptr) return pctxt->standard_error (pctxt, EXR_ERR_OUT_OF_MEMORY);

    nattr  = (exr_attribute_t*) ptr;
    *nattr = nil;
    *attr  = nattr;
    ptr += sizeof (exr_attribute_t);
    if (nlen > 0)
    {
        memcpy (ptr, name, (size_t) (nlen + 1));
        nattr->name        = (char*) ptr;
        nattr->name_length = (uint8_t) nlen;

        ptr += nlen + 1;
    }
    if (tlen > 0)
    {
        memcpy (ptr, type, (size_t) (tlen + 1));
        nattr->type_name        = (char*) ptr;
        nattr->type_name_length = (uint8_t) tlen;

        ptr += tlen + 1;
    }
    ptr += alignpad1;
    if (dblocksize > 0)
    {
        nattr->rawptr = ptr;
        ptr += dblocksize;
    }
    if (data_ptr)
    {
        if (data_len > 0)
        {
            ptr += alignpad2;
            *data_ptr = ptr;
        }
        else
            *data_ptr = NULL;
    }
    return EXR_ERR_SUCCESS;
}